

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

Point3f * phyr::offsetRayOrigin
                    (Point3f *__return_storage_ptr__,Point3f *p,Normal3f *n,Vector3f *w,
                    Vector3f *fpError)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double local_18 [3];
  
  dVar6 = n->z;
  dVar1 = n->x;
  dVar2 = n->y;
  dVar5 = (ABS(dVar1) * fpError->x + ABS(dVar2) * fpError->y + ABS(dVar6) * fpError->z) * 1024.0;
  local_18[0] = dVar5 * dVar1;
  local_18[1] = dVar5 * dVar2;
  local_18[2] = dVar5 * dVar6;
  if (dVar6 * w->z + w->x * dVar1 + w->y * dVar2 < 0.0) {
    local_18[0] = -(dVar5 * dVar1);
    local_18[1] = -(dVar5 * dVar2);
    local_18[2] = -(dVar5 * dVar6);
  }
  dVar6 = p->z;
  dVar1 = p->y;
  __return_storage_ptr__->x = p->x + local_18[0];
  __return_storage_ptr__->y = dVar1 + local_18[1];
  __return_storage_ptr__->z = dVar6 + local_18[2];
  iVar3 = 0;
  do {
    lVar4 = 0;
    if (iVar3 != 0) {
      lVar4 = (ulong)(iVar3 != 1) * 8 + 8;
    }
    if (*(double *)((long)local_18 + lVar4) <= 0.0) {
      if (*(double *)((long)local_18 + lVar4) < 0.0) {
        dVar6 = *(double *)((long)&__return_storage_ptr__->x + lVar4);
        if (-INFINITY < dVar6) {
          dVar6 = (double)(~-(ulong)(dVar6 == 0.0) & (ulong)dVar6 |
                          -(ulong)(dVar6 == 0.0) & 0x8000000000000000);
          dVar6 = (double)((long)dVar6 + (ulong)(dVar6 <= 0.0) * 2 + -1);
        }
        goto LAB_00107112;
      }
    }
    else {
      dVar6 = *(double *)((long)&__return_storage_ptr__->x + lVar4);
      if (dVar6 < INFINITY) {
        dVar6 = (double)(~-(ulong)(dVar6 == 0.0) & (ulong)dVar6);
        dVar6 = (double)((-(ulong)(dVar6 < 0.0) | 1) + (long)dVar6);
      }
LAB_00107112:
      *(double *)((long)&__return_storage_ptr__->x + lVar4) = dVar6;
    }
    iVar3 = iVar3 + 1;
    if (iVar3 == 3) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

inline Point3f offsetRayOrigin(const Point3f& p, const Normal3f& n,
                               const Vector3f& w, const Vector3f& fpError) {
    Real d = dot(abs(n), fpError);
#ifdef PHYRAY_USE_LONG_P
    d *= 1024;  // Use higher ulps factor for double
#endif

    Vector3f offset = Vector3f(n) * d;
    if (dot(w, n) < 0) offset = -offset;
    Point3f op = p + offset;

    // Round indiviual components up or down depending on the sign
    for (int i = 0; i < 3; i++) {
        if (offset[i] > 0) op[i] = nextFloatUp(op[i]);
        else if (offset[i] < 0) op[i] = nextFloatDown(op[i]);
    }

    return op;
}